

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsInter.c
# Opt level: O0

int Abc_MfsSatAddXor(sat_solver *pSat,int iVarA,int iVarB,int iVarC)

{
  int iVar1;
  lit local_30;
  lit local_2c;
  lit Lits [3];
  int iVarC_local;
  int iVarB_local;
  int iVarA_local;
  sat_solver *pSat_local;
  
  Lits[1] = iVarC;
  Lits[2] = iVarB;
  local_30 = toLitCond(iVarA,1);
  local_2c = toLitCond(Lits[2],1);
  Lits[0] = toLitCond(Lits[1],1);
  iVar1 = sat_solver_addclause(pSat,&local_30,Lits + 1);
  if (iVar1 == 0) {
    pSat_local._4_4_ = 0;
  }
  else {
    local_30 = toLitCond(iVarA,1);
    local_2c = toLitCond(Lits[2],0);
    Lits[0] = toLitCond(Lits[1],0);
    iVar1 = sat_solver_addclause(pSat,&local_30,Lits + 1);
    if (iVar1 == 0) {
      pSat_local._4_4_ = 0;
    }
    else {
      local_30 = toLitCond(iVarA,0);
      local_2c = toLitCond(Lits[2],1);
      Lits[0] = toLitCond(Lits[1],0);
      iVar1 = sat_solver_addclause(pSat,&local_30,Lits + 1);
      if (iVar1 == 0) {
        pSat_local._4_4_ = 0;
      }
      else {
        local_30 = toLitCond(iVarA,0);
        local_2c = toLitCond(Lits[2],0);
        Lits[0] = toLitCond(Lits[1],1);
        iVar1 = sat_solver_addclause(pSat,&local_30,Lits + 1);
        if (iVar1 == 0) {
          pSat_local._4_4_ = 0;
        }
        else {
          pSat_local._4_4_ = 1;
        }
      }
    }
  }
  return pSat_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Adds constraints for the two-input AND-gate.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Abc_MfsSatAddXor( sat_solver * pSat, int iVarA, int iVarB, int iVarC )
{
    lit Lits[3];

    Lits[0] = toLitCond( iVarA, 1 );
    Lits[1] = toLitCond( iVarB, 1 );
    Lits[2] = toLitCond( iVarC, 1 );
    if ( !sat_solver_addclause( pSat, Lits, Lits + 3 ) )
        return 0;

    Lits[0] = toLitCond( iVarA, 1 );
    Lits[1] = toLitCond( iVarB, 0 );
    Lits[2] = toLitCond( iVarC, 0 );
    if ( !sat_solver_addclause( pSat, Lits, Lits + 3 ) )
        return 0;

    Lits[0] = toLitCond( iVarA, 0 );
    Lits[1] = toLitCond( iVarB, 1 );
    Lits[2] = toLitCond( iVarC, 0 );
    if ( !sat_solver_addclause( pSat, Lits, Lits + 3 ) )
        return 0;

    Lits[0] = toLitCond( iVarA, 0 );
    Lits[1] = toLitCond( iVarB, 0 );
    Lits[2] = toLitCond( iVarC, 1 );
    if ( !sat_solver_addclause( pSat, Lits, Lits + 3 ) )
        return 0;

    return 1;
}